

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void cacheEntryClear(Parse *pParse,int i)

{
  yColCache *pyVar1;
  int iVar2;
  i16 iVar3;
  u8 uVar4;
  undefined1 uVar5;
  int iVar6;
  yColCache *pyVar7;
  byte bVar8;
  
  pyVar7 = pParse->aColCache + i;
  if (pParse->aColCache[i].tempReg != '\0') {
    bVar8 = pParse->nTempReg;
    if ((ulong)bVar8 < 8) {
      iVar2 = pParse->aColCache[i].iReg;
      pParse->nTempReg = bVar8 + 1;
      pParse->aTempReg[bVar8] = iVar2;
    }
  }
  bVar8 = pParse->nColCache - 1;
  pParse->nColCache = bVar8;
  if (i < (int)(uint)bVar8) {
    pParse->aColCache[i].lru = pParse->aColCache[bVar8].lru;
    pyVar1 = pParse->aColCache + bVar8;
    iVar3 = pyVar1->iColumn;
    uVar4 = pyVar1->tempReg;
    uVar5 = pyVar1->field_0x7;
    iVar2 = pyVar1->iLevel;
    iVar6 = pyVar1->iReg;
    pyVar7->iTable = pyVar1->iTable;
    pyVar7->iColumn = iVar3;
    pyVar7->tempReg = uVar4;
    pyVar7->field_0x7 = uVar5;
    pParse->aColCache[i].iLevel = iVar2;
    pParse->aColCache[i].iReg = iVar6;
  }
  return;
}

Assistant:

static void cacheEntryClear(Parse *pParse, int i){
  if( pParse->aColCache[i].tempReg ){
    if( pParse->nTempReg<ArraySize(pParse->aTempReg) ){
      pParse->aTempReg[pParse->nTempReg++] = pParse->aColCache[i].iReg;
    }
  }
  pParse->nColCache--;
  if( i<pParse->nColCache ){
    pParse->aColCache[i] = pParse->aColCache[pParse->nColCache];
  }
}